

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O2

void __thiscall SpinLock::SlowLock(SpinLock *this)

{
  int value;
  int iVar1;
  int loop;
  bool bVar2;
  
  loop = 0;
  do {
    value = SpinLoop(this);
    while (value == 1) {
      LOCK();
      iVar1 = (this->lockword_).super___atomic_base<int>._M_i;
      bVar2 = iVar1 == 1;
      value = 2;
      if (bVar2) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        iVar1 = 1;
      }
      UNLOCK();
      if (bVar2) goto LAB_0011ac50;
      if (iVar1 != 0) {
        if (iVar1 != 1) {
          value = iVar1;
        }
        goto LAB_0011ac50;
      }
      LOCK();
      value = (this->lockword_).super___atomic_base<int>._M_i;
      if (value == 0) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        value = 0;
      }
      UNLOCK();
    }
    if (value == 0) {
      return;
    }
LAB_0011ac50:
    loop = loop + 1;
    base::internal::SpinLockDelay(&this->lockword_,value,loop);
  } while( true );
}

Assistant:

void SpinLock::SlowLock() {
  int lock_value = SpinLoop();

  int lock_wait_call_count = 0;
  while (lock_value != kSpinLockFree) {
    // If the lock is currently held, but not marked as having a sleeper, mark
    // it as having a sleeper.
    if (lock_value == kSpinLockHeld) {
      // Here, just "mark" that the thread is going to sleep.  Don't
      // store the lock wait time in the lock as that will cause the
      // current lock owner to think it experienced contention. Note,
      // compare_exchange updates lock_value with previous value of
      // lock word.
      lockword_.compare_exchange_strong(lock_value, kSpinLockSleeper,
                                        std::memory_order_acquire);
      if (lock_value == kSpinLockHeld) {
        // Successfully transitioned to kSpinLockSleeper.  Pass
        // kSpinLockSleeper to the SpinLockDelay routine to properly indicate
        // the last lock_value observed.
        lock_value = kSpinLockSleeper;
      } else if (lock_value == kSpinLockFree) {
        // Lock is free again, so try and acquire it before sleeping.  The
        // new lock state will be the number of cycles this thread waited if
        // this thread obtains the lock.
        lockword_.compare_exchange_strong(lock_value, kSpinLockSleeper, std::memory_order_acquire);
        continue;  // skip the delay at the end of the loop
      }
    }

    // Wait for an OS specific delay.
    base::internal::SpinLockDelay(&lockword_, lock_value,
                                  ++lock_wait_call_count);
    // Spin again after returning from the wait routine to give this thread
    // some chance of obtaining the lock.
    lock_value = SpinLoop();
  }
}